

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void pq_ensure_unlinked(PacketQueueNode *node)

{
  PacketQueueNode *pPVar1;
  PacketQueueNode *pPVar2;
  uint __line;
  char *__assertion;
  
  if (node->on_free_queue == true) {
    pPVar1 = node->next;
    pPVar2 = node->prev;
    pPVar1->prev = pPVar2;
    pPVar2->next = pPVar1;
    return;
  }
  if (node->next == (PacketQueueNode *)0x0) {
    if (node->prev == (PacketQueueNode *)0x0) {
      return;
    }
    __assertion = "!node->prev";
    __line = 0x1c;
  }
  else {
    __assertion = "!node->next";
    __line = 0x1b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                __line,"void pq_ensure_unlinked(PacketQueueNode *)");
}

Assistant:

static void pq_ensure_unlinked(PacketQueueNode *node)
{
    if (node->on_free_queue) {
        node->next->prev = node->prev;
        node->prev->next = node->next;
    } else {
        assert(!node->next);
        assert(!node->prev);
    }
}